

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

TX_SIZE av1_get_adjusted_tx_size(TX_SIZE tx_size)

{
  int iVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,tx_size);
  iVar1 = 3;
  if ((1 < iVar2 - 0xbU) && (iVar2 != 4)) {
    if (iVar2 == 0x11) {
      return '\t';
    }
    iVar1 = iVar2;
    if (iVar2 == 0x12) {
      return '\n';
    }
  }
  return (TX_SIZE)iVar1;
}

Assistant:

static inline TX_SIZE av1_get_adjusted_tx_size(TX_SIZE tx_size) {
  switch (tx_size) {
    case TX_64X64:
    case TX_64X32:
    case TX_32X64: return TX_32X32;
    case TX_64X16: return TX_32X16;
    case TX_16X64: return TX_16X32;
    default: return tx_size;
  }
}